

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::write_content_with_provider
          (Server *this,Stream *strm,Request *req,Response *res,string *boundary,
          string *content_type)

{
  size_t content_length;
  pointer ppVar1;
  pointer ppVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  EncodingType EVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  anon_class_8_1_8991fb9c is_shutting_down;
  anon_class_8_1_8991fb9c local_28;
  compressor *local_20;
  
  content_length = res->content_length_;
  local_28.this = this;
  if (content_length == 0) {
    if (res->is_chunked_content_provider_ == true) {
      EVar5 = detail::encoding_type(req,res);
      if ((EVar5 - Gzip < 2) ||
         (detail::make_unique<httplib::detail::nocompressor>(), local_20 == (compressor *)0x0)) {
        __assert_fail("compressor != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h"
                      ,0x1423,
                      "bool httplib::Server::write_content_with_provider(Stream &, const Request &, Response &, const std::string &, const std::string &)"
                     );
      }
      bVar4 = detail::
              write_content_chunked<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_,httplib::detail::compressor>
                        (strm,&res->content_provider_,&local_28,local_20);
      (*local_20->_vptr_compressor[1])(local_20);
    }
    else {
      bVar4 = detail::
              write_content_without_length<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_>
                        (strm,&res->content_provider_,&local_28);
    }
  }
  else {
    ppVar1 = (req->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (req->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (ppVar1 == ppVar2) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = content_length;
      pVar6 = (pair<unsigned_long,_unsigned_long>)(auVar3 << 0x40);
    }
    else {
      if ((long)ppVar2 - (long)ppVar1 != 0x10) {
        bVar4 = detail::
                write_multipart_ranges_data<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_>
                          (strm,req,res,boundary,content_type,&local_28);
        return bVar4;
      }
      pVar6 = detail::get_range_offset_and_length(req,content_length,0);
    }
    bVar4 = detail::
            write_content<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_>
                      (strm,&res->content_provider_,pVar6.first,pVar6.second,&local_28);
  }
  return bVar4;
}

Assistant:

inline bool
Server::write_content_with_provider(Stream &strm, const Request &req,
                                    Response &res, const std::string &boundary,
                                    const std::string &content_type) {
  auto is_shutting_down = [this]() {
    return this->svr_sock_ == INVALID_SOCKET;
  };

  if (res.content_length_ > 0) {
    if (req.ranges.empty()) {
      return detail::write_content(strm, res.content_provider_, 0,
                                   res.content_length_, is_shutting_down);
    } else if (req.ranges.size() == 1) {
      auto offsets =
          detail::get_range_offset_and_length(req, res.content_length_, 0);
      auto offset = offsets.first;
      auto length = offsets.second;
      return detail::write_content(strm, res.content_provider_, offset, length,
                                   is_shutting_down);
    } else {
      return detail::write_multipart_ranges_data(
          strm, req, res, boundary, content_type, is_shutting_down);
    }
  } else {
    if (res.is_chunked_content_provider_) {
      auto type = detail::encoding_type(req, res);

      std::unique_ptr<detail::compressor> compressor;
      if (type == detail::EncodingType::Gzip) {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
        compressor = detail::make_unique<detail::gzip_compressor>();
#endif
      } else if (type == detail::EncodingType::Brotli) {
#ifdef CPPHTTPLIB_BROTLI_SUPPORT
        compressor = detail::make_unique<detail::brotli_compressor>();
#endif
      } else {
        compressor = detail::make_unique<detail::nocompressor>();
      }
      assert(compressor != nullptr);

      return detail::write_content_chunked(strm, res.content_provider_,
                                           is_shutting_down, *compressor);
    } else {
      return detail::write_content_without_length(strm, res.content_provider_,
                                                  is_shutting_down);
    }
  }
}